

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * duckdb_fmt::v6::internal::
       parse_arg_id<char,duckdb_fmt::v6::internal::id_adapter<duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>>,char,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>&,char>>
                 (char *begin,char *end,
                 id_adapter<duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_&,_char>
                 *handler)

{
  byte bVar1;
  format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  *pfVar2;
  byte *pbVar3;
  undefined8 uVar4;
  uint id;
  byte *pbVar5;
  byte *pbVar6;
  basic_string_view<char> name;
  anon_union_16_15_055d57a1_for_value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_a8;
  type local_98 [6];
  undefined1 *local_80;
  long local_78;
  undefined1 local_70 [16];
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  bVar1 = *begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
    ::on_arg_id(handler->handler);
    return begin;
  }
  if (9 < (byte)(bVar1 - 0x30)) {
    if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
      pbVar5 = (byte *)(begin + 1);
      do {
        pbVar3 = pbVar5;
        pbVar6 = (byte *)end;
        if (pbVar3 == (byte *)end) break;
        bVar1 = *pbVar3;
        pbVar5 = pbVar3 + 1;
      } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
              (pbVar6 = pbVar3, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
      name.size_ = (long)pbVar6 - (long)begin;
      pfVar2 = handler->handler;
      name.data_ = begin;
      basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
      ::arg((format_arg *)&local_a8.string,&pfVar2->context,name);
      (pfVar2->arg).type_ = local_98[0];
      (pfVar2->arg).value_.field_0.long_long_value = local_a8.long_long_value;
      (pfVar2->arg).value_.field_0.string.size = local_a8.string.size;
      return (char *)pbVar6;
    }
    goto LAB_0075bfd3;
  }
  pbVar5 = (byte *)(begin + 1);
  id = 0;
  pbVar6 = pbVar5;
  if (bVar1 == 0x30) {
LAB_0075bf17:
    if ((pbVar5 != (byte *)end) && ((*pbVar5 == 0x3a || (*pbVar5 == 0x7d)))) {
      format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
      ::on_arg_id(handler->handler,id);
      return (char *)pbVar5;
    }
  }
  else {
    do {
      if (0xccccccc < id) goto LAB_0075bf37;
      id = ((uint)bVar1 + id * 10) - 0x30;
      pbVar5 = (byte *)end;
      if (pbVar6 == (byte *)end) break;
      bVar1 = *pbVar6;
      pbVar5 = pbVar6;
      pbVar6 = pbVar6 + 1;
    } while ((byte)(bVar1 - 0x30) < 10);
    if (-1 < (int)id) goto LAB_0075bf17;
LAB_0075bf37:
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"number is too big","");
    handler = (id_adapter<duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_&,_char>
               *)handler->handler;
    local_a8.pointer = local_98;
    std::__cxx11::string::_M_construct<char*>((string *)&local_a8,local_40,local_40 + local_38);
    duckdb_fmt::v6::internal::error_handler::on_error(handler,&local_a8);
  }
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"invalid format string","");
  handler = *(id_adapter<duckdb_fmt::v6::format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_&,_char>
              **)handler;
  local_a8.pointer = local_98;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a8,local_60,local_60 + local_58);
  duckdb_fmt::v6::internal::error_handler::on_error(handler,&local_a8);
LAB_0075bfd3:
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"invalid format string","");
  uVar4 = *(undefined8 *)
           &((format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
              *)handler)->field_0x0;
  local_a8.pointer = local_98;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a8,local_80,local_80 + local_78);
  uVar4 = duckdb_fmt::v6::internal::error_handler::on_error(uVar4,&local_a8);
  if (local_a8._0_8_ != local_98) {
    operator_delete(local_a8.pointer);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  _Unwind_Resume(uVar4);
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}